

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O3

int sc_core::sc_report_handler::stop_after(char *msg_type_,int limit)

{
  sc_msg_def *psVar1;
  uint uVar2;
  uint uVar3;
  
  psVar1 = mdlookup(msg_type_);
  if (psVar1 == (sc_msg_def *)0x0) {
    psVar1 = add_msg_type(msg_type_);
  }
  uVar3 = psVar1->limit_mask;
  uVar2 = 0xffffffff;
  if ((uVar3 & 1) != 0) {
    uVar2 = psVar1->limit;
  }
  if (limit < 0) {
    uVar3 = uVar3 & 0xfffffffe;
  }
  else {
    uVar3 = uVar3 | 1;
    psVar1->limit = limit;
  }
  psVar1->limit_mask = uVar3;
  return uVar2;
}

Assistant:

int sc_report_handler::stop_after(const char * msg_type_, int limit)
{
    sc_msg_def * md = mdlookup(msg_type_);

    if ( !md )
	md = add_msg_type(msg_type_);

    int old = md->limit_mask & 1 ? md->limit: UINT_MAX;

    if ( limit < 0 )
	md->limit_mask &= ~1;
    else
    {
	md->limit_mask |= 1;
	md->limit = limit;
    }
    return old;
}